

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

char * stumpless_get_entry_param_value_by_name
                 (stumpless_entry *entry,char *element_name,char *param_name)

{
  _Bool _Var1;
  stumpless_element *element_00;
  stumpless_element *element;
  size_t param_name_len;
  char *param_name_local;
  char *element_name_local;
  stumpless_entry *entry_local;
  
  param_name_len = (size_t)param_name;
  param_name_local = element_name;
  element_name_local = (char *)entry;
  if (param_name == (char *)0x0) {
    raise_argument_empty("param_name was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else {
    _Var1 = validate_param_name(param_name,(size_t *)&element);
    if (_Var1) {
      element_00 = stumpless_get_element_by_name
                             ((stumpless_entry *)element_name_local,param_name_local);
      if (element_00 == (stumpless_element *)0x0) {
        entry_local = (stumpless_entry *)0x0;
      }
      else {
        entry_local = (stumpless_entry *)
                      stumpless_get_param_value_by_name(element_00,(char *)param_name_len);
      }
    }
    else {
      entry_local = (stumpless_entry *)0x0;
    }
  }
  return (char *)entry_local;
}

Assistant:

const char *
stumpless_get_entry_param_value_by_name( const struct stumpless_entry *entry,
                                         const char *element_name,
                                         const char *param_name ) {
  size_t param_name_len;
  const struct stumpless_element *element;

  VALIDATE_ARG_NOT_NULL( param_name );

  if( unlikely( !validate_param_name( param_name, &param_name_len ) ) ) {
    return NULL;
  }

  element = stumpless_get_element_by_name( entry, element_name );
  if( !element ) {
    return NULL;
  }

  return stumpless_get_param_value_by_name( element, param_name );
}